

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

bool console_getline(string *_cmd,CommandList *_commands,Sandbox *_sandbox)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ostream *poVar11;
  _Rb_tree_node_base *p_Var12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  size_t sVar15;
  ulong uVar16;
  pointer pCVar17;
  char *pcVar18;
  string *psVar19;
  MEVENT m;
  string local_c0;
  Sandbox *local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (uniforms == (Uniforms *)0x0) {
    uniforms = &_sandbox->uniforms;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,cmd_abi_cxx11_._M_dataplus._M_p,
             cmd_abi_cxx11_._M_dataplus._M_p + cmd_abi_cxx11_._M_string_length);
  suggest(&local_50,&local_70,&cmd_suggested_abi_cxx11_,_commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  console_refresh();
  uVar8 = wgetch(_stdscr);
  iVar9 = 0x442c08;
  sVar15 = 0;
  std::__cxx11::string::_M_replace
            (0x442c08,0,(char *)cmd_suggested_abi_cxx11_._M_string_length,0x3194fe);
  if ((uVar8 == 0x154) || (uVar8 == 9)) {
    sVar15 = cmd_tab_counter + 1;
  }
  cmd_tab_counter = sVar15;
  if ((int)uVar8 < 0x148) {
    if ((int)uVar8 < 0x7f) {
      if (uVar8 == 9) goto switchD_001ecc99_caseD_154;
      if (uVar8 == 10) goto switchD_001ecc99_caseD_14f;
      if (uVar8 != 0x20) goto switchD_001ecc99_caseD_14c;
switchD_001ecc20_caseD_101:
      std::__cxx11::string::append((char *)&cmd_abi_cxx11_);
    }
    else {
      switch(uVar8) {
      case 0x101:
        goto switchD_001ecc20_caseD_101;
      case 0x102:
        if (cmd_history_offset != 0 &&
            cmd_history_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            cmd_history_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          cmd_cursor_offset = 0;
          cmd_history_offset = cmd_history_offset - 1;
          if (cmd_history_offset != 0) goto LAB_001ed28f;
          std::__cxx11::string::operator=((string *)&cmd_abi_cxx11_,"");
        }
        break;
      case 0x103:
        uVar16 = (long)cmd_history_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)cmd_history_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (cmd_history_offset < uVar16 - 1) {
          cmd_history_offset = cmd_history_offset + 1;
        }
        cmd_cursor_offset = 0;
        if (cmd_history_offset < uVar16) {
LAB_001ed28f:
          cmd_cursor_offset = 0;
          psVar19 = &cmd_abi_cxx11_;
LAB_001ed476:
          std::__cxx11::string::_M_assign((string *)psVar19);
        }
        break;
      case 0x104:
        cmd_cursor_offset =
             cmd_cursor_offset + (cmd_cursor_offset < cmd_abi_cxx11_._M_string_length);
        break;
      case 0x105:
        bVar6 = cmd_cursor_offset != 0;
        sVar15 = cmd_cursor_offset - 1;
        cmd_cursor_offset = 0;
        if (bVar6) {
          cmd_cursor_offset = sVar15;
        }
        break;
      case 0x106:
        pcVar18 = "KEY_HOME";
        lVar10 = 8;
        goto LAB_001ed2b1;
      case 0x108:
        pcVar18 = "KEY_F0";
        goto LAB_001ed2ac;
      default:
        if (uVar8 != 0x7f) goto switchD_001ecc99_caseD_14c;
      case 0x107:
switchD_001ecc20_caseD_107:
        if (cmd_cursor_offset < cmd_abi_cxx11_._M_string_length) {
          uVar16 = ~cmd_cursor_offset + cmd_abi_cxx11_._M_string_length;
          if (cmd_cursor_offset == 0) {
            lVar10 = ~cmd_cursor_offset + cmd_abi_cxx11_._M_string_length;
            cmd_abi_cxx11_._M_string_length = uVar16;
            cmd_abi_cxx11_._M_dataplus._M_p[lVar10] = '\0';
          }
          else {
            std::__cxx11::string::_M_erase(0x442be8,uVar16);
          }
        }
      }
    }
    goto LAB_001ed2e0;
  }
  switch(uVar8) {
  case 0x148:
    pcVar18 = "KEY_DL";
    goto LAB_001ed2ac;
  case 0x149:
    pcVar18 = "KEY_IL";
    goto LAB_001ed2ac;
  case 0x14a:
    goto switchD_001ecc20_caseD_107;
  case 0x14b:
    pcVar18 = "KEY_IC";
LAB_001ed2ac:
    lVar10 = 6;
LAB_001ed2b1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,lVar10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    goto LAB_001ed2e0;
  case 0x14c:
  case 0x151:
  case 0x152:
  case 0x155:
  case 0x156:
    goto switchD_001ecc99_caseD_14c;
  case 0x14d:
    pcVar18 = "KEY_CLEAR";
    lVar10 = 9;
    goto LAB_001ed2b1;
  case 0x14e:
    pcVar18 = "KEY_EOS";
    lVar10 = 7;
    goto LAB_001ed2b1;
  case 0x14f:
  case 0x157:
switchD_001ecc99_caseD_14f:
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cout_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cerr_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cmd_history_abi_cxx11_,&cmd_abi_cxx11_);
    cmd_cursor_offset = 0;
    cmd_history_offset = 0;
    std::__cxx11::string::_M_assign((string *)_cmd);
    std::__cxx11::string::_M_replace(0x442be8,0,(char *)cmd_abi_cxx11_._M_string_length,0x3194fe);
    goto LAB_001ed2e5;
  case 0x150:
  case 0x153:
    out_offset_line = out_offset_line + 1;
    goto LAB_001ed1ab;
  case 0x154:
switchD_001ecc99_caseD_154:
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cout_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    std::__cxx11::stringbuf::str((string *)(buffer_cerr_abi_cxx11_ + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (cmd_abi_cxx11_._M_string_length != 0) {
      lVar10 = std::__cxx11::string::find(-0x18,0x2c);
      if (lVar10 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Suggestions:\n",0xd);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,cmd_abi_cxx11_._M_dataplus._M_p,
                   cmd_abi_cxx11_._M_dataplus._M_p + cmd_abi_cxx11_._M_string_length);
        suggest(&local_c0,&local_90,&cmd_suggested_abi_cxx11_,_commands);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_c0._M_dataplus._M_p,
                   CONCAT44(local_c0._M_string_length._4_4_,(int)local_c0._M_string_length));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,
                          CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                   local_c0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((cmd_tab_counter < 2) || (cmd_suggested_abi_cxx11_._M_string_length == 0)) {
          psVar19 = &cmd_suggested_abi_cxx11_;
          goto LAB_001ed476;
        }
        std::__cxx11::string::_M_assign((string *)&cmd_abi_cxx11_);
        cmd_tab_counter = 0;
      }
      else {
        local_98 = (ulong)uVar8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Use:",4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        pCVar17 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
            super__Vector_impl_data._M_finish != pCVar17) {
          lVar10 = 0;
          uVar16 = 0;
          local_a0 = _sandbox;
          do {
            bVar6 = vera::beginsWith(&cmd_abi_cxx11_,
                                     (string *)((long)&(pCVar17->trigger)._M_dataplus._M_p + lVar10)
                                    );
            if (bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      ",6);
              lVar4 = std::cout;
              *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                       *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                            *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
              *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18))
                   = 0x10;
              pCVar17 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   *(char **)((long)&(pCVar17->formula)._M_dataplus._M_p + lVar10),
                                   *(long *)((long)&(pCVar17->formula)._M_string_length + lVar10));
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   ",3);
              pCVar17 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,*(char **)((long)&(pCVar17->description)._M_dataplus._M_p
                                                     + lVar10),
                                   *(long *)((long)&(pCVar17->description)._M_string_length + lVar10
                                            ));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              _sandbox = local_a0;
              std::ostream::put((char)poVar11);
              std::ostream::flush();
            }
            uVar16 = uVar16 + 1;
            pCVar17 = (_commands->super__Vector_base<Command,_std::allocator<Command>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar10 = lVar10 + 0x88;
          } while (uVar16 < (ulong)(((long)(_commands->
                                           super__Vector_base<Command,_std::allocator<Command>_>).
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pCVar17
                                    >> 3) * -0xf0f0f0f0f0f0f0f));
        }
        for (p_Var12 = (_sandbox->uniforms).data._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var12 !=
            &(_sandbox->uniforms).data._M_t._M_impl.super__Rb_tree_header;
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          bVar6 = vera::beginsWith(&cmd_abi_cxx11_,(string *)(p_Var12 + 1));
          if (bVar6) {
            pcVar18 = *(char **)(p_Var12 + 1);
            p_Var14 = p_Var12[1]._M_parent;
            while (std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,pcVar18,(long)p_Var14),
                  *(long *)(p_Var12 + 5) != 0) {
              p_Var14 = (_Base_ptr)0x8;
              pcVar18 = ",<value>";
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nNotes:",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "      - <values> between <...> brakets need to be change for and actual value",
                   0x4d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "      - when words are separated by | you must choose one of the options, like: A|B|C"
                   ,0x55);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"      * everything betwee [...] is optative",0x2b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        uVar8 = (uint)local_98;
      }
    }
    goto LAB_001ed2e0;
  default:
    if (uVar8 == 0x19a) {
      console_sigwinch_handler(iVar9);
      goto LAB_001ed2e0;
    }
switchD_001ecc99_caseD_14c:
    if (uVar8 - 0x151 < 2) {
      out_offset_line = out_offset_line + -1;
LAB_001ed1ab:
      refresh_out_win();
      goto LAB_001ed2e0;
    }
  }
  switch(uVar8) {
  case 0x155:
    pcVar18 = "KEY_CTAB";
    break;
  default:
    std::__cxx11::string::_M_replace_aux
              (0x442be8,cmd_abi_cxx11_._M_string_length - cmd_cursor_offset,0,'\x01');
    goto LAB_001ed2e0;
  case 0x158:
    pcVar18 = "KEY_SRESET";
    goto LAB_001ed81b;
  case 0x159:
    pcVar18 = "KEY_RESET";
    goto LAB_001ed7b9;
  case 0x15a:
    pcVar18 = "KEY_PRINT";
    goto LAB_001ed7b9;
  case 0x15b:
    pcVar18 = "KEY_LL";
    goto LAB_001ed7f1;
  case 0x15c:
    pcVar18 = "KEY_A1";
    goto LAB_001ed7f1;
  case 0x15d:
    pcVar18 = "KEY_A3";
    goto LAB_001ed7f1;
  case 0x15e:
    pcVar18 = "KEY_B2";
    goto LAB_001ed7f1;
  case 0x15f:
    pcVar18 = "KEY_C1";
    goto LAB_001ed7f1;
  case 0x160:
    pcVar18 = "KEY_C3";
LAB_001ed7f1:
    lVar10 = 6;
    goto LAB_001ed85a;
  case 0x161:
    pcVar18 = "KEY_BTAB";
    break;
  case 0x162:
    pcVar18 = "KEY_BEG";
    goto LAB_001ed806;
  case 0x163:
    pcVar18 = "KEY_CANCEL";
    goto LAB_001ed81b;
  case 0x164:
    pcVar18 = "KEY_CLOSE";
    goto LAB_001ed7b9;
  case 0x165:
    pcVar18 = "KEY_COMMAND";
    goto LAB_001ed840;
  case 0x166:
    pcVar18 = "KEY_COPY";
    break;
  case 0x167:
    pcVar18 = "KEY_CREATE";
    goto LAB_001ed81b;
  case 0x168:
    pcVar18 = "KEY_END";
LAB_001ed806:
    lVar10 = 7;
    goto LAB_001ed85a;
  case 0x169:
    pcVar18 = "KEY_EXIT";
    break;
  case 0x16a:
    pcVar18 = "KEY_FIND";
    break;
  case 0x16b:
    pcVar18 = "KEY_HELP";
    break;
  case 0x16c:
    pcVar18 = "KEY_MARK";
    break;
  case 0x16d:
    pcVar18 = "KEY_MESSAGE";
    goto LAB_001ed840;
  case 0x16e:
    pcVar18 = "KEY_MOVE";
    break;
  case 0x16f:
    pcVar18 = "KEY_NEXT";
    break;
  case 0x170:
    pcVar18 = "KEY_OPEN";
    break;
  case 0x173:
    pcVar18 = "KEY_REDO";
    break;
  case 0x175:
    pcVar18 = "KEY_REFRESH";
LAB_001ed840:
    lVar10 = 0xb;
    goto LAB_001ed85a;
  case 0x178:
    pcVar18 = "KEY_RESUME";
    goto LAB_001ed81b;
  case 0x189:
    pcVar18 = "KEY_SLEFT";
LAB_001ed7b9:
    lVar10 = 9;
    goto LAB_001ed85a;
  case 0x192:
    pcVar18 = "KEY_SRIGHT";
LAB_001ed81b:
    lVar10 = 10;
    goto LAB_001ed85a;
  case 0x199:
    if (((mouse_capture_enabled == true) && (iVar9 = getmouse(&local_c0), iVar9 == 0)) &&
       (stt_visible == true)) {
      puVar2 = (undefined1 *)((long)&local_c0._M_dataplus._M_p + 4);
      cVar7 = wenclose(stt_win,(int)local_c0._M_string_length,local_c0._M_dataplus._M_p._4_4_);
      if ((cVar7 == '\0') || ((local_c0.field_2._M_local_buf[0] & 2U) == 0)) {
        if ((local_c0.field_2._M_local_buf[0] & 1U) != 0) {
          iVar9 = -1;
          if ((-1 < mouse_at) &&
             (cVar7 = wmouse_trafo(stt_win,&local_c0._M_string_length,puVar2,0), iVar3 = mouse_x,
             cVar7 != '\0')) {
            iVar5 = local_c0._M_dataplus._M_p._4_4_;
            local_a0 = (Sandbox *)CONCAT44(local_a0._4_4_,mouse_y);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                      ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
            if (pmVar13->size < 5) {
              local_a0 = (Sandbox *)
                         CONCAT44(local_a0._4_4_,
                                  (float)(iVar5 - iVar3) * 0.01 +
                                  (float)((int)local_c0._M_string_length - (int)local_a0._0_4_) *
                                  0.1);
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                        ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
              (pmVar13->value)._M_elems[mouse_at_index] =
                   local_a0._0_4_ + (pmVar13->value)._M_elems[mouse_at_index];
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                        ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
              pmVar13->change = true;
              (*(uniforms->super_Scene)._vptr_Scene[0x3b])();
            }
          }
LAB_001ed8ab:
          mouse_at = iVar9;
        }
      }
      else {
        cVar7 = wmouse_trafo(stt_win,&local_c0._M_string_length,puVar2,0);
        if (cVar7 != '\0') {
          mouse_x = local_c0._M_dataplus._M_p._4_4_;
          mouse_y = (int)local_c0._M_string_length;
          iVar9 = (int)local_c0._M_string_length - uniforms_starts_at;
          if (uniforms_starts_at <= (int)local_c0._M_string_length) goto LAB_001ed8ab;
        }
      }
    }
    goto LAB_001ed2e0;
  }
  lVar10 = 8;
LAB_001ed85a:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,lVar10);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_001ed2e0:
  refresh_cursor();
LAB_001ed2e5:
  return uVar8 == 0x14f || (uVar8 == 0x157 || uVar8 == 10);
}

Assistant:

bool console_getline(std::string& _cmd, CommandList& _commands, Sandbox& _sandbox) {
    #if defined(SUPPORT_NCURSES)

    if (uniforms == nullptr)
        uniforms = &_sandbox.uniforms;

    suggest(cmd, cmd_suggested, _commands);
    console_refresh();

    int ch = getch();
    cmd_suggested = "";
    if (ch == KEY_STAB || ch == '\t') 
        cmd_tab_counter++;
    else
        cmd_tab_counter = 0;

    if ( ch == '\n' || ch == KEY_ENTER || ch == KEY_EOL) {
        buffer_cout.str("");
        buffer_cerr.str("");
        cmd_history.push_back( cmd );
        cmd_cursor_offset = 0;
        cmd_history_offset = 0;

        _cmd = cmd;
        cmd = "";

        return true;
    }
    else if ( ch == KEY_BACKSPACE || ch == KEY_DC || ch == 127 ) {
        if (cmd.size() > cmd_cursor_offset)
            cmd.erase(cmd.end()-cmd_cursor_offset-1, cmd.end()-cmd_cursor_offset);
    }
    else if ( ch == KEY_STAB || ch == '\t') {
        buffer_cout.str("");
        buffer_cerr.str("");
        if (cmd.size() > 0) {
            if (cmd.find(',') == std::string::npos) {
                std::cout << "Suggestions:\n" << std::endl;
                // cmd_suggested = "";
                std::cout << suggest(cmd, cmd_suggested, _commands);

                if (cmd_tab_counter > 1 && cmd_suggested.size() > 0) {
                    cmd = cmd_suggested;
                    cmd_tab_counter = 0;
                }
                else
                    cmd_suggested = cmd_suggested;
            }
            else {
                std::cout << "Use:" << std::endl;

                for (size_t i = 0; i < _commands.size(); i++)
                    if ( vera::beginsWith(cmd, _commands[i].trigger) )
                        std::cout << "      " << std::left << std::setw(16) << _commands[i].formula << "   " << _commands[i].description << std::endl;

                for (UniformDataMap::iterator it = _sandbox.uniforms.data.begin(); it != _sandbox.uniforms.data.end(); ++it) {
                    if ( vera::beginsWith(cmd, it->first) ) {
                        std::cout << it->first;

                        for (size_t i = 0; it->second.size; i++)
                            std::cout << ",<value>";
                        
                        std::cout << std::endl;
                    }
                }

                std::cout << "\nNotes:" << std::endl;
                std::cout << "      - <values> between <...> brakets need to be change for and actual value" << std::endl;
                std::cout << "      - when words are separated by | you must choose one of the options, like: A|B|C" << std::endl;
                std::cout << "      * everything betwee [...] is optative" << std::endl;
            }
        }
    }
    else if ( ch == KEY_BREAK || ch == ' ') {
        cmd += "_";
    }
    else if ( ch == KEY_LEFT)
        cmd_cursor_offset += cmd_cursor_offset < cmd.size() ? 1 : 0;
    else if ( ch == KEY_RIGHT)
        cmd_cursor_offset = cmd_cursor_offset == 0 ? 0 : cmd_cursor_offset-1;
    else if ( ch == KEY_DOWN ) {
        if (cmd_history.size() > 0 && cmd_history_offset > 0) {
            cmd_history_offset--;
            cmd_cursor_offset = 0;

            if (cmd_history_offset == 0)
                cmd = "";
            else
                cmd = cmd_history[ cmd_history.size() - cmd_history_offset ];
        }
    }
    else if ( ch == KEY_UP ) {
        if (cmd_history_offset < cmd_history.size() - 1)
            cmd_history_offset++;
        cmd_cursor_offset = 0;
        if (cmd_history_offset < cmd_history.size() )
            cmd = cmd_history[ cmd_history.size() - 1 - cmd_history_offset ];
    }
    else if ( ch == KEY_RESIZE)
        console_sigwinch_handler(0);
    else if ( ch == KEY_HOME)
        std::cout << "KEY_HOME" << std::endl;
    else if ( ch == KEY_F0)
        std::cout << "KEY_F0" << std::endl;
    else if ( ch == KEY_DL )
        std::cout << "KEY_DL" << std::endl;
    else if ( ch == KEY_IL )
        std::cout << "KEY_IL" << std::endl;
    else if ( ch == KEY_DC )
        std::cout << "KEY_DC" << std::endl;
    else if ( ch == KEY_IC )
        std::cout << "KEY_IC" << std::endl;
    else if ( ch == KEY_CLEAR)
        std::cout << "KEY_CLEAR" << std::endl;
    else if ( ch == KEY_EOS)
        std::cout << "KEY_EOS" << std::endl;
    else if ( ch == KEY_EOL)
        std::cout << "KEY_EOL" << std::endl;
    else if ( ch == KEY_SF || ch == 339 ) {
        out_offset_line++;
        refresh_out_win();
    }
    else if ( ch == KEY_SR || ch == 338 ) {
        out_offset_line--;
        refresh_out_win();
    }
    else if ( ch == KEY_NPAGE)
        std::cout << "KEY_NPAGE" << std::endl;
    else if ( ch == KEY_PPAGE)
        std::cout << "KEY_PPAGE" << std::endl;
    else if ( ch == KEY_CTAB)
        std::cout << "KEY_CTAB" << std::endl;
    else if ( ch == KEY_BTAB)
        std::cout << "KEY_BTAB" << std::endl;
    else if ( ch == KEY_SRESET)
        std::cout << "KEY_SRESET" << std::endl;
    else if ( ch == KEY_RESET)
        std::cout << "KEY_RESET" << std::endl;
    else if ( ch == KEY_PRINT)
        std::cout << "KEY_PRINT" << std::endl;
    else if ( ch == KEY_LL)
        std::cout << "KEY_LL" << std::endl;
    else if ( ch == KEY_A1)
        std::cout << "KEY_A1" << std::endl;
    else if ( ch == KEY_A3)
        std::cout << "KEY_A3" << std::endl;
    else if ( ch == KEY_B2)
        std::cout << "KEY_B2" << std::endl;
    else if ( ch == KEY_C1)
        std::cout << "KEY_C1" << std::endl;
    else if ( ch == KEY_C3)
        std::cout << "KEY_C3" << std::endl;
    else if ( ch == KEY_BEG)
        std::cout << "KEY_BEG" << std::endl;
    else if ( ch == KEY_CANCEL)
        std::cout << "KEY_CANCEL" << std::endl;
    else if ( ch == KEY_CLOSE)
        std::cout << "KEY_CLOSE" << std::endl;
    else if ( ch == KEY_COMMAND)
        std::cout << "KEY_COMMAND" << std::endl;
    else if ( ch == KEY_COPY)
        std::cout << "KEY_COPY" << std::endl;
    else if ( ch == KEY_CREATE)
        std::cout << "KEY_CREATE" << std::endl;
    else if ( ch == KEY_END)
        std::cout << "KEY_END" << std::endl;
    else if ( ch == KEY_EXIT)
        std::cout << "KEY_EXIT" << std::endl;
    else if ( ch == KEY_FIND)
        std::cout << "KEY_FIND" << std::endl;
    else if ( ch == KEY_HELP)
        std::cout << "KEY_HELP" << std::endl;
    else if ( ch == KEY_MARK)
        std::cout << "KEY_MARK" << std::endl;
    else if ( ch == KEY_MESSAGE)
        std::cout << "KEY_MESSAGE" << std::endl;
    else if ( ch == KEY_MOUSE) {
        if (mouse_capture_enabled) {
            MEVENT m;
            if (getmouse(&m) == OK) {
                if (stt_visible) {
                    if ( wenclose(stt_win, m.y, m.x) && (m.bstate & BUTTON1_PRESSED) ) {
                        if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                            mouse_x = m.x;
                            mouse_y = m.y;
                            if (mouse_y >= uniforms_starts_at)
                                mouse_at = mouse_y - uniforms_starts_at;
                        }
                    }
                    else if ( m.bstate & BUTTON1_RELEASED) {
                        if (mouse_at >= 0) {
                            if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                                float delta = (m.x - mouse_x) * 0.01 + (m.y - mouse_y) * 0.1;
                                if (uniforms->data[mouse_at_key].size < 5) {
                                    uniforms->data[mouse_at_key].value[mouse_at_index] += delta;
                                    uniforms->data[mouse_at_key].change = true;
                                    uniforms->flagChange();
                                }
                            }
                        }
                        mouse_at = -1;
                    }
                }
            }
        }
    }
    else if ( ch == KEY_MOVE)
        std::cout << "KEY_MOVE" << std::endl;
    else if ( ch == KEY_NEXT)
        std::cout << "KEY_NEXT" << std::endl;
    else if ( ch == KEY_OPEN)
        std::cout << "KEY_OPEN" << std::endl;
    else if ( ch == KEY_REDO)
        std::cout << "KEY_REDO" << std::endl;
    else if ( ch == KEY_REFRESH)
        std::cout << "KEY_REFRESH" << std::endl;
    else if ( ch == KEY_RESUME)
        std::cout << "KEY_RESUME" << std::endl;
    else if ( ch == KEY_SLEFT)
        std::cout << "KEY_SLEFT" << std::endl;
    else if ( ch == KEY_SRIGHT)
        std::cout << "KEY_SRIGHT" << std::endl;

    
    // else if ( ch == KEY_END || ch == KEY_EXIT || ch == 27 || ch == EOF) {
    //     keepRunnig = false;
    //     keepRunnig.store(false);
    //     break;
    // }
    else
        cmd.insert(cmd.end() - cmd_cursor_offset, 1, (char)ch );  
      
    refresh_cursor();
    // suggest(cmd, cmd_suggested, _commands);
    #endif

    return false;
}